

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

bool __thiscall MetricsDiscovery::MDHelper::SaveReportsFromStream(MDHelper *this)

{
  long *plVar1;
  long lVar2;
  size_type sVar3;
  char *pcVar4;
  vector<char,_std::allocator<char>_> *in_RDI;
  TCompletionCode res;
  char *pNextReportData;
  uint32_t reportsToRead;
  uint32_t reportSize;
  uint32_t cMinNumReports;
  uint32_t cMaxNumReports;
  int local_20;
  int local_1c;
  undefined4 uVar5;
  undefined4 uVar6;
  vector<char,_std::allocator<char>_> *this_00;
  bool local_1;
  
  if ((((in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 & 1) == 0) ||
      (*(long *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl == 0)) ||
     (*(long *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 == 0)) {
    local_1 = false;
  }
  else if ((*(uint *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xc &
           1) == 0) {
    local_1 = false;
  }
  else {
    uVar6 = 0x100;
    uVar5 = 0x10;
    this_00 = in_RDI;
    lVar2 = (**(code **)(**(long **)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.field_0x8 + 0x10))();
    local_1c = *(int *)(lVar2 + 0x18);
    sVar3 = std::vector<char,_std::allocator<char>_>::capacity
                      ((vector<char,_std::allocator<char>_> *)
                       &in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                      );
    if (sVar3 < (uint)(local_1c << 8)) {
      std::vector<char,_std::allocator<char>_>::resize(this_00,CONCAT44(uVar6,uVar5));
      *(undefined4 *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
           0;
    }
    local_20 = 0x100 - *(int *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x10;
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x275e5d);
    plVar1 = *(long **)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl;
    (**(code **)(*plVar1 + 0x28))
              (plVar1,&local_20,
               pcVar4 + (uint)(local_1c *
                              *(int *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.field_0x10),0);
    *(int *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
         local_20 +
         *(int *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    local_1 = 0xf < *(uint *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10;
  }
  return local_1;
}

Assistant:

bool MDHelper::SaveReportsFromStream( void )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet )
    {
        DebugPrint("Can't GetReportFromStream!\n");
        return false;
    }

    if( !( m_APIMask & API_TYPE_IOSTREAM ) )
    {
        DebugPrint("SaveReportsFromStream requires API_TYPE_IOSTREAM!\n");
        return false;
    }

    const uint32_t  cMaxNumReports = 256;
    const uint32_t  cMinNumReports = 16;

    const uint32_t  reportSize = m_MetricSet->GetParams()->RawReportSize;

    if( m_SavedReportData.capacity() < reportSize * cMaxNumReports )
    {
        m_SavedReportData.resize( reportSize * cMaxNumReports );
        m_NumSavedReports = 0;
    }

    uint32_t    reportsToRead = cMaxNumReports - m_NumSavedReports;
    char*       pNextReportData = m_SavedReportData.data() + reportSize * m_NumSavedReports;

    DebugPrint("SaveReportsFromStream: currently have %d reports, reading up to %d more reports.\n", m_NumSavedReports, reportsToRead);

    TCompletionCode res = m_ConcurrentGroup->ReadIoStream(
        &reportsToRead,
        pNextReportData,
        0 );

    if( res == CC_READ_PENDING )
    {
        DebugPrint("CC_READ_PENDING: Read %d reports from the stream.\n", reportsToRead);
    }
    else if( res == CC_OK )
    {
        DebugPrint("CC_OK: Read %d reports from the stream.\n", reportsToRead);
    }
    else
    {
        DebugPrint("Error reading from stream: res = %d\n", (int)res);
    }

    m_NumSavedReports += reportsToRead;

    DebugPrint("SaveReportsFromStream: read %d reports, now there are %d saved reports.\n", reportsToRead, m_NumSavedReports);

    return m_NumSavedReports >= cMinNumReports;
}